

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Liby::Connection::runEventHandler(Connection *this,BasicHandler *handler)

{
  bool bVar1;
  BasicHandler *handler_local;
  Connection *this_local;
  
  bVar1 = false;
  if (this->loop_ != (EventLoop *)0x0) {
    bVar1 = this->poller_ != (Poller *)0x0;
  }
  if (bVar1) {
    bVar1 = std::function::operator_cast_to_bool((function *)handler);
    if (bVar1) {
      EventLoop::runEventHandler(this->loop_,handler);
    }
    return;
  }
  __assert_fail("loop_ && poller_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp"
                ,0x2f,"void Liby::Connection::runEventHandler(const BasicHandler &)");
}

Assistant:

void Connection::runEventHandler(const BasicHandler &handler) {
    assert(loop_ && poller_);

    if (!handler) {
        return;
    }

    loop_->runEventHandler(handler);
}